

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_0::LoadStoreTestInstance::checkRequirements(LoadStoreTestInstance *this)

{
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_00;
  string local_40;
  
  pVVar1 = Context::getDeviceFeatures((this->super_BaseTestInstance).super_TestInstance.m_context);
  if (((this->super_BaseTestInstance).m_declareImageFormatInShader == false) &&
     (pVVar1->shaderStorageImageReadWithoutFormat == 0)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"shaderStorageImageReadWithoutFormat feature not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void LoadStoreTestInstance::checkRequirements (void)
{
	const VkPhysicalDeviceFeatures	features	= m_context.getDeviceFeatures();

	if (!m_declareImageFormatInShader && !features.shaderStorageImageReadWithoutFormat)
		throw tcu::NotSupportedError("shaderStorageImageReadWithoutFormat feature not supported");
}